

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::startLoopImpl(Connection *this)

{
  SourceLocation location;
  char *local_38;
  char *pcStack_30;
  HttpServer *local_28;
  
  loop((Connection *)&stack0xffffffffffffffc0);
  local_38 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_30 = "startLoopImpl";
  local_28 = (HttpServer *)0xc00001cf1;
  location.function = "startLoopImpl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1cf1;
  location.columnNumber = 0xc;
  Promise<kj::HttpServer::Connection::LoopResult>::
  catch_<kj::HttpServer::Connection::startLoopImpl()::_lambda(kj::Exception&&)_1_>
            ((Promise<kj::HttpServer::Connection::LoopResult> *)this,
             (anon_class_8_1_8991fb9c_for_errorHandler *)&stack0xffffffffffffffc0,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffc0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<LoopResult> startLoopImpl() {
    return loop().catch_([this](kj::Exception&& e) {
      // Exception; report 5xx.

      KJ_IF_SOME(p, webSocketError) {
        // sendWebSocketError() was called. Finish sending and close the connection. Don't log
        // the exception because it's probably a side-effect of this.
        auto promise = kj::mv(p);
        webSocketError = kj::none;
        return kj::mv(promise);
      }

      KJ_IF_SOME(p, tunnelRejected) {
        // reject() was called to reject a CONNECT request. Finish sending and close the connection.
        // Don't log the exception because it's probably a side-effect of this.
        auto promise = kj::mv(p);
        tunnelRejected = kj::none;
        return kj::mv(promise);
      }

      return sendError(kj::mv(e));
    });
  }